

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void __thiscall
embree::ISPCGridMesh::ISPCGridMesh
          (ISPCGridMesh *this,RTCDevice device,TutorialScene *scene_in,
          Ref<embree::SceneGraph::GridMeshNode> *in)

{
  ulong uVar1;
  undefined4 uVar2;
  uint uVar3;
  RTCGeometry pRVar4;
  void *pvVar5;
  size_t sVar6;
  Vec3fa *pVVar7;
  Grid *pGVar8;
  long *in_RCX;
  undefined8 in_RSI;
  ISPCGeometry *in_RDI;
  size_t i;
  GridMeshNode *in_stack_fffffffffffffe68;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffffe70;
  TutorialScene *in_stack_fffffffffffffe78;
  long *local_b0;
  ulong local_a8;
  undefined8 local_80;
  long *local_70;
  long **local_68;
  long **local_60;
  
  local_80 = in_RSI;
  ISPCGeometry::ISPCGeometry(in_RDI,GRID_MESH);
  *(undefined8 *)(in_RDI + 1) = 0;
  pRVar4 = (RTCGeometry)rtcNewGeometry(local_80,2);
  in_RDI->geometry = pRVar4;
  SceneGraph::GridMeshNode::numTimeSteps((GridMeshNode *)0x1b8fe4);
  pvVar5 = alignedUSMMalloc((size_t)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68,
                            DEFAULT);
  *(void **)(in_RDI + 1) = pvVar5;
  local_a8 = 0;
  while( true ) {
    uVar1 = local_a8;
    sVar6 = SceneGraph::GridMeshNode::numTimeSteps((GridMeshNode *)0x1b9073);
    if (sVar6 <= uVar1) break;
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  *)(*in_RCX + 0x70),local_a8);
    pVVar7 = copyArrayToUSM<embree::Vec3fa>((avector<embree::Vec3fa> *)in_stack_fffffffffffffe68);
    *(Vec3fa **)(*(long *)(in_RDI + 1) + local_a8 * 8) = pVVar7;
    local_a8 = local_a8 + 1;
  }
  in_RDI[1].materialID = *(uint *)(*in_RCX + 0x68);
  *(undefined4 *)&in_RDI[1].visited = *(undefined4 *)(*in_RCX + 0x6c);
  sVar6 = SceneGraph::GridMeshNode::numTimeSteps((GridMeshNode *)0x1b91d4);
  in_RDI[2].type = (ISPCType)sVar6;
  sVar6 = SceneGraph::GridMeshNode::numVertices(in_stack_fffffffffffffe68);
  *(int *)&in_RDI[2].field_0x4 = (int)sVar6;
  uVar2 = (**(code **)(*(long *)*in_RCX + 0x70))();
  *(undefined4 *)&in_RDI[2].geometry = uVar2;
  local_70 = (long *)(*in_RCX + 0xa0);
  local_68 = &local_b0;
  local_b0 = (long *)*local_70;
  if (local_b0 != (long *)0x0) {
    (**(code **)(*local_b0 + 0x10))();
  }
  uVar3 = TutorialScene::materialID(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  in_RDI->materialID = uVar3;
  local_60 = &local_b0;
  if (local_b0 != (long *)0x0) {
    (**(code **)(*local_b0 + 0x18))();
  }
  pGVar8 = copyArrayToUSM<embree::SceneGraph::GridMeshNode::Grid>
                     ((vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                       *)*in_RCX);
  in_RDI[1].geometry = (RTCGeometry)pGVar8;
  return;
}

Assistant:

ISPCGridMesh::ISPCGridMesh (RTCDevice device, TutorialScene* scene_in, Ref<SceneGraph::GridMeshNode> in) 
    : geom(GRID_MESH), positions(nullptr)
  {
    geom.geometry = rtcNewGeometry (device, RTC_GEOMETRY_TYPE_GRID);
    
    positions = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*in->numTimeSteps());
    for (size_t i=0; i<in->numTimeSteps(); i++)
      positions[i] = copyArrayToUSM(in->positions[i]);

    startTime = in->time_range.lower;
    endTime   = in->time_range.upper;
    numTimeSteps = (unsigned) in->numTimeSteps();
    numVertices = (unsigned) in->numVertices();
    numGrids = (unsigned) in->numPrimitives();
    geom.materialID = scene_in->materialID(in->material);
    grids = (ISPCGrid*) copyArrayToUSM(in->grids);
  }